

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O1

bool __thiscall dtc::input_buffer::consume_binary<unsigned_int>(input_buffer *this,uint *out)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  iVar1 = this->cursor;
  iVar5 = 4 - iVar1 % 4;
  if (iVar1 % 4 == 0) {
    iVar5 = 0;
  }
  if (this->size < iVar5 + iVar1 + 4) {
    uVar3 = 0;
  }
  else {
    this->cursor = iVar5 + iVar1;
    if ((iVar5 + iVar1 & 3U) != 0) {
      __assert_fail("cursor % type_size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/input_buffer.hh"
                    ,0xf4,"bool dtc::input_buffer::consume_binary(T &) [T = unsigned int]");
    }
    *out = 0;
    uVar3 = 0;
    if (this->cursor <= this->size) {
      pcVar2 = this->buffer;
      do {
        uVar4 = uVar3;
        *out = *out << 8;
        iVar1 = this->cursor;
        this->cursor = iVar1 + 1;
        *out = *out | (uint)(byte)pcVar2[iVar1];
        if (uVar4 == 3) break;
        uVar3 = uVar4 + 1;
      } while (this->cursor <= this->size);
      uVar3 = (uint)(2 < uVar4);
    }
  }
  return SUB41(uVar3,0);
}

Assistant:

bool consume_binary(T &out)
	{
		int align = 0;
		int type_size = sizeof(T);
		if (cursor % type_size != 0)
		{
			align = type_size - (cursor % type_size);
		}
		if (size < cursor + align + type_size)
		{
			return false;
		}
		cursor += align;
		assert(cursor % type_size == 0);
		out = 0;
		for (int i=0 ; i<type_size ; ++i)
		{
			if (size < cursor)
			{
				return false;
			}
			out <<= 8;
			out |= (((T)buffer[cursor++]) & 0xff);
		}
		return true;
	}